

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O1

void __thiscall ProblemTest_AddLogicalCon_Test::TestBody(ProblemTest_AddLogicalCon_Test *this)

{
  bool bVar1;
  char *pcVar2;
  MutLogicalCon MVar3;
  LogicalExpr expr2;
  AssertionResult gtest_ar;
  LogicalExpr expr;
  Problem p;
  AssertHelper local_390;
  AssertHelper local_388;
  internal local_380 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  AssertHelper local_368;
  BasicProblem<mp::BasicProblemParams<int>_> local_360;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_360);
  local_370.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_370.ptr_._4_4_ << 0x20);
  local_388.data_._0_4_ =
       (int)((ulong)((long)local_360.logical_cons_.
                           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_360.logical_cons_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            (local_380,"0","p.num_logical_cons()",(int *)&local_370,(int *)&local_388);
  if (local_380[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_370.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_370.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_370.ptr_ + 8))();
      }
      local_370.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_370.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                 (&local_360.super_ExprFactory,true);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&local_360,(LogicalExpr)local_370.ptr_);
  local_388.data_._0_4_ = 1;
  local_390.data_._0_4_ =
       (int)((ulong)((long)local_360.logical_cons_.
                           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_360.logical_cons_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            (local_380,"1","p.num_logical_cons()",(int *)&local_388,(int *)&local_390);
  if (local_380[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1ad,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_388.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_388.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_388.data_ + 8))();
      }
      local_388.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&local_360,0);
  local_388.data_ =
       (AssertHelperData *)
       ((MVar3.
         super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
       logical_cons_).
       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
       ._M_impl.super__Vector_impl_data._M_start
       [MVar3.
        super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
        .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
       super_ExprBase.impl_;
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            (local_380,"expr","ccon.expr()",
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&local_370,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&local_388);
  if (local_380[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1b0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_388.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_388.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_388.data_ + 8))();
      }
      local_388.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_388.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                 ((BasicExprFactory<std::allocator<char>> *)&local_360,NOT,
                  (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)local_370.ptr_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&local_360,(LogicalExpr)local_388.data_);
  local_390.data_._0_4_ = 2;
  local_368.data_._0_4_ =
       (undefined4)
       ((ulong)((long)local_360.logical_cons_.
                      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_360.logical_cons_.
                     super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            (local_380,"2","p.num_logical_cons()",(int *)&local_390,(int *)&local_368);
  if (local_380[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1b4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_368,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    if (local_390.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_390.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_390.data_ + 8))();
      }
      local_390.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&local_360,1);
  local_390.data_ =
       (AssertHelperData *)
       ((MVar3.
         super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
       logical_cons_).
       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
       ._M_impl.super__Vector_impl_data._M_start
       [MVar3.
        super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
        .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
       super_ExprBase.impl_;
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            (local_380,"expr2","con.expr()",
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&local_388,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&local_390);
  if (local_380[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_368,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    if (local_390.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_390.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_390.data_ + 8))();
      }
      local_390.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_360);
  return;
}

Assistant:

TEST(ProblemTest, AddLogicalCon) {
  Problem p;
  EXPECT_EQ(0, p.num_logical_cons());

  mp::LogicalExpr expr = p.MakeLogicalConstant(true);
  p.AddCon(expr);
  EXPECT_EQ(1, p.num_logical_cons());
  Problem::LogicalCon con = p.logical_con(0);
  const Problem::LogicalCon ccon = con;
  EXPECT_EQ(expr, ccon.expr());

  mp::LogicalExpr expr2 = p.MakeNot(expr);
  p.AddCon(expr2);
  EXPECT_EQ(2, p.num_logical_cons());
  con = p.logical_con(1);
  EXPECT_EQ(expr2, con.expr());
}